

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrioExecution.h
# Opt level: O2

void nrg::PrioExecution::
     push<void(*)(std::ostream&,int_const&),std::reference_wrapper<std::ostream>,int>
               (Queue *queue,_func_void_basic_ostream<char,_std::char_traits<char>_>_ptr_int_ptr *fn
               ,reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_> *param,
               int *param_4)

{
  QueueElement elem;
  QueueElement local_80;
  QueueElement local_58;
  anon_class_24_3_7e084ec6 local_30;
  
  local_58.prio = 0;
  local_58.id = next()::nxt;
  local_30.param =
       (reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_>)param->_M_data;
  local_30._16_4_ = *param_4;
  next()::nxt = next()::nxt + 1;
  local_30.fn = fn;
  std::function<void()>::
  function<nrg::PrioExecution::push<void(*)(std::ostream&,int_const&),std::reference_wrapper<std::ostream>,int>(std::priority_queue<nrg::PrioExecution::QueueElement,std::vector<nrg::PrioExecution::QueueElement,std::allocator<nrg::PrioExecution::QueueElement>>,std::greater<nrg::PrioExecution::QueueElement>>&,void(*)(std::ostream&,int_const&),std::reference_wrapper<std::ostream>&&,int&&)::_lambda()_1_,void>
            ((function<void()> *)&local_58.what,&local_30);
  QueueElement::QueueElement(&local_80,&local_58);
  std::
  priority_queue<nrg::PrioExecution::QueueElement,_std::vector<nrg::PrioExecution::QueueElement,_std::allocator<nrg::PrioExecution::QueueElement>_>,_std::greater<nrg::PrioExecution::QueueElement>_>
  ::push(queue,&local_80);
  std::_Function_base::~_Function_base(&local_80.what.super__Function_base);
  std::_Function_base::~_Function_base(&local_58.what.super__Function_base);
  return;
}

Assistant:

static void push(Queue& queue, FN fn, Param&&... param)
    {
        QueueElement elem = { 0, next(), [=]() { fn(param...); } };
        push(queue, std::move(elem));
    }